

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O2

bool __thiscall wasm::ExecutionResults::areEqual(ExecutionResults *this,Literal *a,Literal *b)

{
  ulong uVar1;
  Literal LVar2;
  Literal LVar3;
  bool bVar4;
  char cVar5;
  ostream *poVar6;
  undefined8 in_stack_ffffffffffffff98;
  HeapType in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  Literal local_40;
  
  uVar1 = (a->type).id;
  if ((uVar1 & 1) == 0 && 6 < uVar1) {
    bVar4 = Type::isString(&a->type);
    if (!bVar4) {
      in_stack_ffffffffffffffa0 = Type::getHeapType(&a->type);
      bVar4 = HeapType::isMaybeShared((HeapType *)&stack0xffffffffffffffa0,i31);
      if (!bVar4) {
        return true;
      }
    }
  }
  cVar5 = ::wasm::Literal::operator!=(a,b);
  if (cVar5 != '\0') {
    poVar6 = std::operator<<((ostream *)&std::cout,"values not identical! ");
    ::wasm::Literal::Literal((Literal *)&stack0xffffffffffffffa8,a);
    LVar2.field_0.func.super_IString.str._M_str = (char *)in_stack_ffffffffffffffa0.id;
    LVar2.field_0.i64 = in_stack_ffffffffffffff98;
    LVar2.type.id = in_stack_ffffffffffffffa8;
    poVar6 = (ostream *)::wasm::operator<<(poVar6,LVar2);
    poVar6 = std::operator<<(poVar6," != ");
    ::wasm::Literal::Literal(&local_40,b);
    LVar3.field_0.func.super_IString.str._M_str = (char *)in_stack_ffffffffffffffa0.id;
    LVar3.field_0.i64 = in_stack_ffffffffffffff98;
    LVar3.type.id = in_stack_ffffffffffffffa8;
    poVar6 = (ostream *)::wasm::operator<<(poVar6,LVar3);
    std::operator<<(poVar6,'\n');
    ::wasm::Literal::~Literal(&local_40);
    ::wasm::Literal::~Literal((Literal *)&stack0xffffffffffffffa8);
  }
  return cVar5 == '\0';
}

Assistant:

bool areEqual(Literal a, Literal b) {
    // Don't compare references. There are several issues here that we can't
    // fully handle, see https://github.com/WebAssembly/binaryen/issues/3378,
    // but the core issue is that since we optimize assuming a closed world, the
    // types and structure of GC data can arbitrarily change after
    // optimizations, even in ways that are externally visible from outside
    // the module.
    //
    // We can, however, compare strings as they refer to simple data that has a
    // consistent representation (the same reasons as why we can print them in
    // printValue(), above).
    //
    // TODO: Once we support optimizing under some form of open-world
    // assumption, we should be able to check that the types and/or structure of
    // GC data passed out of the module does not change.
    if (a.type.isRef() && !a.type.isString() &&
        !a.type.getHeapType().isMaybeShared(HeapType::i31)) {
      return true;
    }
    if (a != b) {
      std::cout << "values not identical! " << a << " != " << b << '\n';
      return false;
    }
    return true;
  }